

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_target(Curl_easy *data,connectdata *conn,dynbuf *r)

{
  byte bVar1;
  CURLUcode CVar2;
  int iVar3;
  CURLcode CVar4;
  char *in_RAX;
  CURLU *u;
  char *pcVar5;
  char *str;
  char *pcVar6;
  char *url;
  char *local_38;
  
  pcVar5 = (data->set).str[0x42];
  str = pcVar5;
  if (pcVar5 == (char *)0x0) {
    str = (data->state).up.path;
  }
  pcVar6 = (char *)0x0;
  if (pcVar5 == (char *)0x0) {
    pcVar6 = (data->state).up.query;
  }
  if (((uint)conn->bits & 9) != 1) {
    CVar4 = Curl_dyn_add(r,str);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (pcVar6 == (char *)0x0) {
      return CURLE_OK;
    }
    CVar4 = Curl_dyn_addf(r,"?%s",pcVar6);
    return CVar4;
  }
  local_38 = in_RAX;
  u = curl_url_dup((data->state).uh);
  if (u == (CURLU *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar5 = (conn->host).name;
  if (((((conn->host).dispname != pcVar5) &&
       (CVar2 = curl_url_set(u,CURLUPART_HOST,pcVar5,0), CVar2 != CURLUE_OK)) ||
      (CVar2 = curl_url_set(u,CURLUPART_FRAGMENT,(char *)0x0,0), CVar2 != CURLUE_OK)) ||
     ((iVar3 = curl_strequal("http",(data->state).up.scheme), iVar3 != 0 &&
      ((CVar2 = curl_url_set(u,CURLUPART_USER,(char *)0x0,0), CVar2 != CURLUE_OK ||
       (CVar2 = curl_url_set(u,CURLUPART_PASSWORD,(char *)0x0,0), CVar2 != CURLUE_OK)))))) {
    curl_url_cleanup(u);
    return CURLE_OUT_OF_MEMORY;
  }
  CVar2 = curl_url_get(u,CURLUPART_URL,&local_38,2);
  curl_url_cleanup(u);
  if (CVar2 != CURLUE_OK) {
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar5 = (data->set).str[0x42];
  if (pcVar5 == (char *)0x0) {
    pcVar5 = local_38;
  }
  CVar4 = Curl_dyn_add(r,pcVar5);
  (*Curl_cfree)(local_38);
  if (CVar4 != CURLE_OK) {
    return CVar4;
  }
  iVar3 = curl_strequal("ftp",(data->state).up.scheme);
  if (iVar3 == 0) {
    return CURLE_OK;
  }
  if (((data->set).field_0x8be & 0x20) == 0) {
    return CURLE_OK;
  }
  pcVar5 = strstr(str,";type=");
  if (pcVar5 != (char *)0x0) {
    if (pcVar5[6] == '\0') {
      return CURLE_OK;
    }
    if (pcVar5[7] != '\0') {
      return CURLE_OK;
    }
    bVar1 = Curl_raw_toupper(pcVar5[6]);
    if ((bVar1 - 0x41 < 9) && ((0x109U >> (bVar1 - 0x41 & 0x1f) & 1) != 0)) {
      return CURLE_OK;
    }
  }
  CVar4 = Curl_dyn_addf(r,";type=%c",
                        (ulong)((uint)((*(uint *)&(data->state).field_0x74c >> 0xe & 1) == 0) * 8 +
                               0x61));
  if (CVar4 == CURLE_OK) {
    return CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_http_target(struct Curl_easy *data,
                          struct connectdata *conn,
                          struct dynbuf *r)
{
  CURLcode result = CURLE_OK;
  const char *path = data->state.up.path;
  const char *query = data->state.up.query;

  if(data->set.str[STRING_TARGET]) {
    path = data->set.str[STRING_TARGET];
    query = NULL;
  }

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    /* Using a proxy but does not tunnel through it */

    /* The path sent to the proxy is in fact the entire URL. But if the remote
       host is a IDN-name, we must make sure that the request we produce only
       uses the encoded host name! */

    /* and no fragment part */
    CURLUcode uc;
    char *url;
    CURLU *h = curl_url_dup(data->state.uh);
    if(!h)
      return CURLE_OUT_OF_MEMORY;

    if(conn->host.dispname != conn->host.name) {
      uc = curl_url_set(h, CURLUPART_HOST, conn->host.name, 0);
      if(uc) {
        curl_url_cleanup(h);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    uc = curl_url_set(h, CURLUPART_FRAGMENT, NULL, 0);
    if(uc) {
      curl_url_cleanup(h);
      return CURLE_OUT_OF_MEMORY;
    }

    if(strcasecompare("http", data->state.up.scheme)) {
      /* when getting HTTP, we don't want the userinfo the URL */
      uc = curl_url_set(h, CURLUPART_USER, NULL, 0);
      if(uc) {
        curl_url_cleanup(h);
        return CURLE_OUT_OF_MEMORY;
      }
      uc = curl_url_set(h, CURLUPART_PASSWORD, NULL, 0);
      if(uc) {
        curl_url_cleanup(h);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    /* Extract the URL to use in the request. */
    uc = curl_url_get(h, CURLUPART_URL, &url, CURLU_NO_DEFAULT_PORT);
    if(uc) {
      curl_url_cleanup(h);
      return CURLE_OUT_OF_MEMORY;
    }

    curl_url_cleanup(h);

    /* target or url */
    result = Curl_dyn_add(r, data->set.str[STRING_TARGET]?
      data->set.str[STRING_TARGET]:url);
    free(url);
    if(result)
      return (result);

    if(strcasecompare("ftp", data->state.up.scheme)) {
      if(data->set.proxy_transfer_mode) {
        /* when doing ftp, append ;type=<a|i> if not present */
        char *type = strstr(path, ";type=");
        if(type && type[6] && type[7] == 0) {
          switch(Curl_raw_toupper(type[6])) {
          case 'A':
          case 'D':
          case 'I':
            break;
          default:
            type = NULL;
          }
        }
        if(!type) {
          result = Curl_dyn_addf(r, ";type=%c",
                                 data->state.prefer_ascii ? 'a' : 'i');
          if(result)
            return result;
        }
      }
    }
  }

  else
#else
    (void)conn; /* not used in disabled-proxy builds */
#endif
  {
    result = Curl_dyn_add(r, path);
    if(result)
      return result;
    if(query)
      result = Curl_dyn_addf(r, "?%s", query);
  }

  return result;
}